

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

int h2o_cache_set(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash,
                 h2o_iovec_t value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  kh_cache_t *h;
  khint32_t *pkVar4;
  ulong uVar5;
  khint_t kVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  h2o_cache_ref_t *key_00;
  sbyte sVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  h2o_iovec_t hVar18;
  
  if (keyhash == 0) {
    keyhash = h2o_cache_calchash(key.base,key.len);
  }
  key_00 = (h2o_cache_ref_t *)h2o_mem_alloc(0x60);
  hVar18 = h2o_strdup((h2o_mem_pool_t *)0x0,key.base,key.len);
  key_00->key = hVar18;
  key_00->keyhash = keyhash;
  key_00->at = now;
  (key_00->value).base = value.base;
  (key_00->value).len = value.len;
  key_00->_requested_early_update = 0;
  (key_00->_age_link).next = (st_h2o_linklist_t *)0x0;
  (key_00->_age_link).prev = (st_h2o_linklist_t *)0x0;
  (key_00->_lru_link).next = (st_h2o_linklist_t *)0x0;
  (key_00->_lru_link).prev = (st_h2o_linklist_t *)0x0;
  key_00->_refcnt = 1;
  lock_cache(cache);
  h = cache->table;
  kVar6 = kh_get_cache(h,key_00);
  if (kVar6 == h->n_buckets) {
    if (h->upper_bound <= h->n_occupied) {
      if (h->size * 2 < kVar6) {
        kVar6 = kVar6 - 1;
      }
      else {
        kVar6 = kVar6 + 1;
      }
      iVar7 = kh_resize_cache(h,kVar6);
      if (iVar7 < 0) {
        iVar7 = 0;
        goto LAB_00129892;
      }
    }
    uVar3 = h->n_buckets;
    uVar16 = (ulong)uVar3;
    uVar14 = key_00->keyhash & uVar3 - 1;
    pkVar4 = h->flags;
    if ((pkVar4[uVar14 >> 4] >> ((char)uVar14 * '\x02' & 0x1fU) & 2) == 0) {
      iVar7 = 1;
      uVar15 = uVar14;
      do {
        uVar12 = pkVar4[uVar15 >> 4];
        uVar13 = uVar15 * 2 & 0x1e;
        sVar10 = (sbyte)uVar13;
        uVar8 = uVar12 >> sVar10;
        if (((uVar8 & 2) != 0) ||
           (((uVar8 & 1) == 0 && (iVar9 = is_equal(h->keys[uVar15],key_00), iVar9 != 0)))) {
          bVar17 = (uVar12 >> sVar10 & 2) == 0;
          uVar12 = (uint)uVar16;
          goto LAB_0012980f;
        }
        if ((uVar12 >> uVar13 & 1) != 0) {
          uVar16 = (ulong)uVar15;
        }
        uVar15 = uVar15 + iVar7 & uVar3 - 1;
        iVar7 = iVar7 + 1;
      } while (uVar15 != uVar14);
      bVar17 = true;
      uVar12 = uVar3;
      uVar15 = uVar14;
      if ((uint)uVar16 == uVar3) {
LAB_0012980f:
        if (uVar12 == uVar3) {
          uVar12 = uVar15;
        }
        if (bVar17) {
          uVar12 = uVar15;
        }
        uVar16 = (ulong)uVar12;
      }
    }
    else {
      uVar16 = (ulong)uVar14;
    }
    uVar5 = uVar16 >> 4;
    bVar11 = (char)uVar16 * '\x02' & 0x1e;
    if ((pkVar4[uVar5] >> bVar11 & 2) == 0) {
      if ((pkVar4[uVar5] >> bVar11 & 1) != 0) {
        h->keys[uVar16] = key_00;
        h->flags[uVar5] = h->flags[uVar5] & ~(3 << bVar11);
        h->size = h->size + 1;
      }
    }
    else {
      h->keys[uVar16] = key_00;
      h->flags[uVar5] = h->flags[uVar5] & ~(3 << bVar11);
      uVar1 = h->size;
      uVar2 = h->n_occupied;
      h->size = uVar1 + 1;
      h->n_occupied = uVar2 + 1;
    }
    iVar7 = 0;
  }
  else {
    iVar7 = 1;
    erase_ref(cache,kVar6,1);
    cache->table->keys[kVar6] = key_00;
  }
LAB_00129892:
  h2o_linklist_insert(&cache->lru,&key_00->_lru_link);
  h2o_linklist_insert(&cache->age,&key_00->_age_link);
  cache->size = cache->size + (key_00->value).len;
  purge(cache,now);
  unlock_cache(cache);
  return iVar7;
}

Assistant:

int h2o_cache_set(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash, h2o_iovec_t value)
{
    h2o_cache_ref_t *newref;
    khiter_t iter;
    int existed;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);

    /* create newref */
    newref = h2o_mem_alloc(sizeof(*newref));
    *newref = (h2o_cache_ref_t){h2o_strdup(NULL, key.base, key.len), keyhash, now, value, 0, {NULL}, {NULL}, 1};

    lock_cache(cache);

    /* set or replace the named value */
    iter = kh_get(cache, cache->table, newref);
    if (iter != kh_end(cache->table)) {
        erase_ref(cache, iter, 1);
        kh_key(cache->table, iter) = newref;
        existed = 1;
    } else {
        int unused;
        kh_put(cache, cache->table, newref, &unused);
        existed = 0;
    }
    h2o_linklist_insert(&cache->lru, &newref->_lru_link);
    h2o_linklist_insert(&cache->age, &newref->_age_link);
    cache->size += newref->value.len;

    purge(cache, now);

    unlock_cache(cache);

    return existed;
}